

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

reference __thiscall
slang::SmallVectorBase<std::variant<slang::ast::Statement_const*,slang::ast::Expression_const*>>::
emplace_back<std::variant<slang::ast::Statement_const*,slang::ast::Expression_const*>>
          (SmallVectorBase<std::variant<slang::ast::Statement_const*,slang::ast::Expression_const*>>
           *this,variant<const_slang::ast::Statement_*,_const_slang::ast::Expression_*> *args)

{
  ulong uVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  EVP_PKEY_CTX *pEVar7;
  undefined8 *puVar8;
  EVP_PKEY_CTX *ctx;
  long lVar9;
  
  puVar8 = (undefined8 *)(*(long *)(this + 8) * 0x10 + *(long *)this);
  if (*(long *)(this + 8) != *(long *)(this + 0x10)) {
    uVar2 = *(undefined8 *)
             &(args->
              super__Variant_base<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>).
              super__Move_assign_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>
              .
              super__Copy_assign_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>
              .super__Move_ctor_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>
              .super__Copy_ctor_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>
              .
              super__Variant_storage_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>
              ._M_index;
    *puVar8 = (args->
              super__Variant_base<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>).
              super__Move_assign_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>
              .
              super__Copy_assign_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>
              .super__Move_ctor_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>
              .super__Copy_ctor_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>
              .
              super__Variant_storage_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>
              ._M_u;
    puVar8[1] = uVar2;
    lVar9 = *(long *)(this + 8);
    *(long *)(this + 8) = lVar9 + 1;
    return (reference)(*(long *)this + (lVar9 + 1) * 0x10 + -0x10);
  }
  if (*(long *)(this + 8) == 0x7ffffffffffffff) {
    detail::throwLengthError();
  }
  pEVar7 = (EVP_PKEY_CTX *)(*(long *)(this + 8) + 1);
  uVar1 = *(ulong *)(this + 0x10);
  ctx = (EVP_PKEY_CTX *)(uVar1 * 2);
  if (pEVar7 < ctx) {
    pEVar7 = ctx;
  }
  if (0x7ffffffffffffff - uVar1 < uVar1) {
    pEVar7 = (EVP_PKEY_CTX *)0x7ffffffffffffff;
  }
  lVar9 = (long)puVar8 - *(long *)this;
  puVar3 = (undefined8 *)operator_new((long)pEVar7 << 4);
  uVar2 = *(undefined8 *)
           &(args->
            super__Variant_base<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>).
            super__Move_assign_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>.
            super__Copy_assign_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>.
            super__Move_ctor_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>.
            super__Copy_ctor_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>.
            super__Variant_storage_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>
            ._M_index;
  *(undefined8 *)((long)puVar3 + lVar9) =
       (args->super__Variant_base<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>).
       super__Move_assign_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>.
       super__Copy_assign_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>.
       super__Move_ctor_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>.
       super__Copy_ctor_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>.
       super__Variant_storage_alias<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>.
       _M_u;
  ((undefined8 *)((long)puVar3 + lVar9))[1] = uVar2;
  puVar6 = *(undefined8 **)this;
  puVar4 = puVar6 + *(long *)(this + 8) * 2;
  puVar5 = puVar3;
  if (puVar4 == puVar8) {
    for (; puVar6 != puVar8; puVar6 = puVar6 + 2) {
      uVar2 = puVar6[1];
      *puVar5 = *puVar6;
      puVar5[1] = uVar2;
      puVar5 = puVar5 + 2;
    }
  }
  else {
    for (; puVar6 != puVar8; puVar6 = puVar6 + 2) {
      uVar2 = puVar6[1];
      *puVar5 = *puVar6;
      puVar5[1] = uVar2;
      puVar5 = puVar5 + 2;
    }
    puVar6 = (undefined8 *)(lVar9 + (long)puVar3);
    for (; puVar8 != puVar4; puVar8 = puVar8 + 2) {
      uVar2 = puVar8[1];
      puVar6[2] = *puVar8;
      puVar6[3] = uVar2;
      puVar6 = puVar6 + 2;
    }
  }
  SmallVectorBase<std::variant<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>_>::
  cleanup((SmallVectorBase<std::variant<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>_>
           *)this,ctx);
  *(long *)(this + 8) = *(long *)(this + 8) + 1;
  *(EVP_PKEY_CTX **)(this + 0x10) = pEVar7;
  *(undefined8 **)this = puVar3;
  return (reference)((long)puVar3 + lVar9);
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }